

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void checknext(LexState *ls,int c)

{
  int c_local;
  LexState *ls_local;
  
  check(ls,c);
  luaX_next(ls);
  return;
}

Assistant:

static void checknext(LexState*ls,int c){
check(ls,c);
luaX_next(ls);
}